

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

void __thiscall
kj::StringTree::
fill<kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,capnp::(anonymous_namespace)::Indent,kj::ArrayPtr<char_const>>
          (StringTree *this,char *pos,size_t branchIndex,StringTree *first,
          ArrayPtr<const_char> *rest,StringTree *rest_1,StringTree *rest_2,Indent *rest_3,
          ArrayPtr<const_char> *rest_4)

{
  Branch *pBVar1;
  char *pos_00;
  char *pcVar2;
  
  pcVar2 = (char *)(this->text).content.size_;
  if (pcVar2 != (char *)0x0) {
    pcVar2 = (this->text).content.ptr;
  }
  pBVar1 = (this->branches).ptr + branchIndex;
  pBVar1->index = (long)pos - (long)pcVar2;
  operator=(&pBVar1->content,first);
  pos_00 = _::fill<kj::ArrayPtr<char_const>>(pos,rest);
  pcVar2 = (char *)(this->text).content.size_;
  pBVar1 = (this->branches).ptr;
  if (pcVar2 != (char *)0x0) {
    pcVar2 = (this->text).content.ptr;
  }
  pBVar1[branchIndex + 1].index = (long)pos_00 - (long)pcVar2;
  operator=(&pBVar1[branchIndex + 1].content,rest_1);
  fill<capnp::(anonymous_namespace)::Indent,kj::ArrayPtr<char_const>>
            (this,pos_00,branchIndex + 2,rest_2,rest_3,rest_4);
  return;
}

Assistant:

void StringTree::fill(char* pos, size_t branchIndex, StringTree&& first, Rest&&... rest) {
  branches[branchIndex].index = pos - text.begin();
  branches[branchIndex].content = kj::mv(first);
  fill(pos, branchIndex + 1, kj::fwd<Rest>(rest)...);
}